

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void vera::splitFacesFromVerticalRow<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  ulong uVar1;
  CubemapFace<unsigned_char> *pCVar2;
  uchar *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar7 = (int)(_height / 6);
  iVar5 = (int)_width;
  uVar1 = (long)(((ulong)(uint)(iVar7 * iVar5) << 0x20) * 3) >> 0x20;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar1) {
    uVar4 = uVar1;
  }
  lVar9 = 0;
  do {
    pCVar2 = (CubemapFace<unsigned_char> *)operator_new(0x18);
    pCVar2->id = 0;
    pCVar2->width = 0;
    pCVar2->height = 0;
    pCVar2->currentOffset = 0;
    pCVar2->data = (uchar *)0x0;
    _faces[lVar9] = pCVar2;
    pCVar2->id = (int)lVar9;
    puVar3 = (uchar *)operator_new__(uVar4);
    pCVar2->data = puVar3;
    pCVar2->width = iVar5;
    pCVar2->height = iVar7;
    pCVar2->currentOffset = 0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  if (_height != 0) {
    iVar5 = iVar5 * 3;
    iVar6 = 0;
    uVar4 = 0;
    do {
      lVar9 = 6;
      iVar8 = iVar6;
      do {
        pCVar2 = _faces[(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff)
                             / (long)iVar7)];
        if (pCVar2 != (CubemapFace<unsigned_char> *)0x0) {
          memcpy(pCVar2->data + pCVar2->currentOffset,_data + iVar8,
                 (long)(_width * 0x300000000) >> 0x20);
          pCVar2->currentOffset = pCVar2->currentOffset + iVar5;
        }
        iVar8 = iVar8 + iVar5;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      uVar4 = uVar4 + 1;
      iVar6 = iVar6 + iVar5;
    } while (uVar4 != _height);
  }
  return;
}

Assistant:

void splitFacesFromVerticalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width;
    int faceHeight = _height/6;


    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 j      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[jFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}